

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluProgramInterfaceQuery.cpp
# Opt level: O0

void glu::getProgramResourceName
               (Functions *gl,deUint32 program,deUint32 programInterface,deUint32 index,string *dst)

{
  glGetProgramResourceNameFunc p_Var1;
  int iVar2;
  GLenum err;
  size_type sVar3;
  reference pvVar4;
  ostream *poVar5;
  TestError *this;
  string local_1f8;
  ostringstream local_1d8 [8];
  ostringstream msg;
  allocator_type local_49;
  undefined1 local_48 [8];
  vector<char,_std::allocator<char>_> buf;
  int length;
  string *dst_local;
  deUint32 index_local;
  deUint32 programInterface_local;
  deUint32 program_local;
  Functions *gl_local;
  
  buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ =
       getProgramResourceInt(gl,program,programInterface,index,0x92f9);
  if (0 < (int)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_) {
    iVar2 = buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ + 1;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_48,(long)iVar2,&local_49);
    std::allocator<char>::~allocator(&local_49);
    p_Var1 = gl->getProgramResourceName;
    sVar3 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)local_48);
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_48,0);
    (*p_Var1)(program,programInterface,index,(GLsizei)sVar3,(GLsizei *)0x0,pvVar4);
    err = (*gl->getError)();
    checkError(err,"glGetProgramResourceName()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluProgramInterfaceQuery.cpp"
               ,0x31);
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_48,0);
    std::__cxx11::string::operator=((string *)dst,pvVar4);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_48);
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_1d8);
  poVar5 = std::operator<<((ostream *)local_1d8,"Empty name returned for ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,programInterface);
  poVar5 = std::operator<<(poVar5," at index ");
  std::ostream::operator<<(poVar5,index);
  this = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::ostringstream::str();
  tcu::TestError::TestError(this,&local_1f8);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void getProgramResourceName (const glw::Functions& gl, deUint32 program, deUint32 programInterface, deUint32 index, std::string& dst)
{
	const int length = getProgramResourceInt(gl, program, programInterface, index, GL_NAME_LENGTH);

	if (length > 0)
	{
		std::vector<char> buf(length+1);
		gl.getProgramResourceName(program, programInterface, index, (int)buf.size(), DE_NULL, &buf[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramResourceName()");

		dst = (const char*)&buf[0];
	}
	else
	{
		std::ostringstream msg;
		msg << "Empty name returned for " << programInterface << " at index " << index;
		throw tcu::TestError(msg.str());
	}
}